

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O0

MPP_RET hal_m2vd_vdpu1_deinit(void *hal)

{
  M2vdHalCtx *p;
  MPP_RET ret;
  void *hal_local;
  
  p._4_4_ = MPP_OK;
  if (*(long *)((long)hal + 0x90) != 0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x90));
    *(undefined8 *)((long)hal + 0x90) = 0;
  }
  if (*(long *)((long)hal + 0x78) != 0) {
    p._4_4_ = mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x78),"hal_m2vd_vdpu1_deinit");
    *(undefined8 *)((long)hal + 0x78) = 0;
    if (p._4_4_ != MPP_OK) {
      _mpp_log_l(2,"hal_m2vd_vdpu1","m2v_hal qp_table put buffer failed\n",(char *)0x0);
      return p._4_4_;
    }
  }
  if (*(long *)((long)hal + 0x70) != 0) {
    p._4_4_ = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x70));
    *(undefined8 *)((long)hal + 0x70) = 0;
    if (p._4_4_ != MPP_OK) {
      _mpp_log_l(2,"hal_m2vd_vdpu1","m2v_hal group free buffer failed\n",(char *)0x0);
      return p._4_4_;
    }
  }
  return p._4_4_;
}

Assistant:

MPP_RET hal_m2vd_vdpu1_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *p = (M2vdHalCtx *)hal;

    if (p->dev) {
        mpp_dev_deinit(p->dev);
        p->dev = NULL;
    }

    if (p->qp_table) {
        ret = mpp_buffer_put(p->qp_table);
        p->qp_table = NULL;
        if (MPP_OK !=  ret) {
            mpp_err("m2v_hal qp_table put buffer failed\n");
            return ret;
        }
    }

    if (p->group) {
        ret = mpp_buffer_group_put(p->group);
        p->group = NULL;
        if (ret) {
            mpp_err("m2v_hal group free buffer failed\n");
            return ret;
        }
    }

    return ret;
}